

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sym_tbl.cpp
# Opt level: O0

shared_ptr<mocker::ast::Declaration> __thiscall
mocker::SymTbl::lookUp(SymTbl *this,ScopeID *scopeID,string *identifier)

{
  bool bVar1;
  element_type *peVar2;
  pointer ppVar3;
  key_type *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::ast::Declaration> sVar4;
  shared_ptr<mocker::SymTbl::Scope> local_70;
  undefined4 local_5c;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_true>
  local_58 [3];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_true>
  local_40;
  iterator iter;
  shared_ptr<mocker::SymTbl::Scope> cur;
  string *identifier_local;
  ScopeID *scopeID_local;
  SymTbl *this_local;
  
  getScope((SymTbl *)&iter,scopeID);
  do {
    bVar1 = std::operator!=((shared_ptr<mocker::SymTbl::Scope> *)&iter,(nullptr_t)0x0);
    if (!bVar1) {
      std::shared_ptr<mocker::ast::Declaration>::shared_ptr
                ((shared_ptr<mocker::ast::Declaration> *)this);
LAB_00291225:
      local_5c = 1;
      std::shared_ptr<mocker::SymTbl::Scope>::~shared_ptr
                ((shared_ptr<mocker::SymTbl::Scope> *)&iter);
      sVar4.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX._M_pi;
      sVar4.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<mocker::ast::Declaration>)
             sVar4.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>;
    }
    peVar2 = std::
             __shared_ptr_access<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&iter);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>_>_>
         ::find(&peVar2->syms,in_RCX);
    peVar2 = std::
             __shared_ptr_access<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&iter);
    local_58[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>_>_>
         ::end(&peVar2->syms);
    bVar1 = std::__detail::operator!=(&local_40,local_58);
    if (bVar1) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_false,_true>
                             *)&local_40);
      std::shared_ptr<mocker::ast::Declaration>::shared_ptr
                ((shared_ptr<mocker::ast::Declaration> *)this,&ppVar3->second);
      goto LAB_00291225;
    }
    std::__shared_ptr_access<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&iter);
    std::weak_ptr<mocker::SymTbl::Scope>::lock((weak_ptr<mocker::SymTbl::Scope> *)&local_70);
    std::shared_ptr<mocker::SymTbl::Scope>::operator=
              ((shared_ptr<mocker::SymTbl::Scope> *)&iter,&local_70);
    std::shared_ptr<mocker::SymTbl::Scope>::~shared_ptr(&local_70);
  } while( true );
}

Assistant:

std::shared_ptr<ast::Declaration>
SymTbl::lookUp(const ScopeID &scopeID, const std::string &identifier) const {
  auto cur = getScope(scopeID);
  while (cur != nullptr) {
    auto iter = cur->syms.find(identifier);
    if (iter != cur->syms.end())
      return {iter->second};
    cur = cur->pnt.lock();
  }
  return {};
}